

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O1

void __thiscall ExactFloat::ExactFloat(ExactFloat *this,double v)

{
  undefined1 auVar1 [16];
  int iVar2;
  BIGNUM *pBVar3;
  undefined4 in_ESI;
  uint uVar4;
  double dVar5;
  undefined8 in_XMM0_Qb;
  int exp;
  int local_3c;
  double local_38;
  undefined8 uStack_30;
  S2LogMessage local_20;
  
  local_38 = v;
  uStack_30 = in_XMM0_Qb;
  pBVar3 = BN_new();
  auVar1._8_8_ = uStack_30;
  auVar1._0_8_ = local_38;
  (this->bn_).bn_ = (BIGNUM *)pBVar3;
  uVar4 = movmskpd(in_ESI,auVar1);
  uVar4 = -(uVar4 & 1) | 1;
  this->sign_ = uVar4;
  if (NAN(local_38)) {
    set_nan(this);
  }
  else if (ABS(local_38) == INFINITY) {
    set_inf(this,uVar4);
  }
  else {
    dVar5 = frexp(ABS(local_38),&local_3c);
    dVar5 = ldexp(dVar5,0x35);
    iVar2 = BN_set_word((BIGNUM *)(this->bn_).bn_,
                        (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5);
    if (iVar2 == 0) {
      S2LogMessage::S2LogMessage
                (&local_20,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
                 ,0x57,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_20.stream_,"Check failed: BN_set_word(bn, v) ",0x21);
      abort();
    }
    this->bn_exp_ = local_3c + -0x35;
    Canonicalize(this);
  }
  return;
}

Assistant:

ExactFloat::ExactFloat(double v) {
  sign_ = std::signbit(v) ? -1 : 1;
  if (std::isnan(v)) {
    set_nan();
  } else if (std::isinf(v)) {
    set_inf(sign_);
  } else {
    // The following code is much simpler than messing about with bit masks,
    // has the advantage of handling denormalized numbers and zero correctly,
    // and is actually quite efficient (at least compared to the rest of this
    // code).  "f" is a fraction in the range [0.5, 1), so if we shift it left
    // by the number of mantissa bits in a double (53, including the leading
    // "1") then the result is always an integer.
    int exp;
    double f = frexp(fabs(v), &exp);
    uint64 m = static_cast<uint64>(ldexp(f, kDoubleMantissaBits));
    BN_ext_set_uint64(bn_.get(), m);
    bn_exp_ = exp - kDoubleMantissaBits;
    Canonicalize();
  }
}